

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_fma.cpp
# Opt level: O2

void ncnn::transpose_pack_B_tile(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined8 uVar19;
  long lVar20;
  int iVar22;
  int iVar23;
  long lVar24;
  undefined1 (*pauVar25) [16];
  long lVar26;
  undefined1 (*pauVar27) [32];
  undefined1 (*pauVar28) [32];
  long lVar29;
  long lVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  undefined4 *puVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  bool bVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  long local_80;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  size_t *psVar21;
  
  psVar21 = (size_t *)&B->w;
  if (B->dims == 3) {
    psVar21 = &B->cstep;
  }
  iVar1 = (int)*psVar21;
  lVar20 = (long)iVar1;
  uVar31 = 0;
  iVar22 = 0;
  if (0 < max_kk) {
    iVar22 = max_kk;
  }
  lVar24 = (long)(k * iVar1);
  lVar29 = (long)j;
  lVar30 = lVar24 * 4;
  lVar26 = lVar30 + lVar29 * 4;
  lVar35 = lVar30 + 4 + lVar29 * 4;
  local_50 = lVar30 + 0x10 + lVar29 * 4;
  local_80 = lVar30 + lVar29 * 4 + 0x20;
  lVar32 = lVar29 * 0x20;
  lVar30 = lVar32 + lVar24 * 4;
  lVar29 = lVar29 * 0x10;
  lVar36 = lVar32 + lVar24 * 4 + 0x20;
  local_68 = lVar32 + 0x60 + lVar24 * 4;
  local_58 = lVar32 + 0xe0 + lVar24 * 4;
  local_40 = lVar32 + 0x160 + lVar24 * 4;
  lVar32 = lVar29 + lVar24 * 4;
  lVar33 = lVar29 + 0x10 + lVar24 * 4;
  local_70 = lVar29 + 0x30 + lVar24 * 4;
  local_60 = lVar29 + 0x70 + lVar24 * 4;
  local_48 = lVar29 + 0xb0 + lVar24 * 4;
  pauVar27 = (undefined1 (*) [32])BT->data;
  lVar29 = (long)max_jj;
  lVar37 = (long)(iVar1 * 8) * 4;
  lVar38 = (long)(iVar1 * 4) * 4;
  lVar24 = lVar20 * 4;
  iVar1 = B->elempack;
  for (; (long)uVar31 < lVar29 + -0xb; uVar31 = uVar31 + 0xc) {
    if (iVar1 == 8) {
      pauVar28 = (undefined1 (*) [32])((long)B->data + local_40);
      for (iVar23 = 7; iVar23 < max_kk; iVar23 = iVar23 + 8) {
        auVar18 = vunpcklps_avx(pauVar28[-0xb],pauVar28[-10]);
        auVar11 = vunpckhps_avx(pauVar28[-0xb],pauVar28[-10]);
        auVar46 = vunpcklps_avx(pauVar28[-9],pauVar28[-8]);
        auVar41 = vunpckhps_avx(pauVar28[-9],pauVar28[-8]);
        auVar52 = vunpcklps_avx(pauVar28[-7],pauVar28[-6]);
        auVar40 = vunpckhps_avx(pauVar28[-7],pauVar28[-6]);
        auVar44 = vunpcklps_avx(pauVar28[-5],pauVar28[-4]);
        auVar12 = vunpckhps_avx(pauVar28[-5],pauVar28[-4]);
        auVar47 = vunpcklps_avx(pauVar28[-3],pauVar28[-2]);
        auVar42 = vunpckhps_avx(pauVar28[-3],pauVar28[-2]);
        auVar48 = vunpcklps_avx(pauVar28[-1],*pauVar28);
        auVar13 = vunpckhps_avx(pauVar28[-1],*pauVar28);
        auVar43 = vunpcklpd_avx(auVar18,auVar46);
        auVar18 = vunpckhpd_avx(auVar18,auVar46);
        auVar46 = vunpcklpd_avx(auVar11,auVar41);
        auVar11 = vunpckhpd_avx(auVar11,auVar41);
        auVar45 = vunpcklpd_avx(auVar52,auVar44);
        auVar41 = vunpckhpd_avx(auVar52,auVar44);
        auVar52 = vunpcklpd_avx(auVar40,auVar12);
        auVar40 = vunpckhpd_avx(auVar40,auVar12);
        auVar44 = vunpcklpd_avx(auVar47,auVar48);
        auVar12 = vunpckhpd_avx(auVar47,auVar48);
        auVar47 = vunpcklpd_avx(auVar42,auVar13);
        auVar42 = vunpckhpd_avx(auVar42,auVar13);
        auVar48._16_16_ = auVar45._0_16_;
        auVar48._0_16_ = auVar43._0_16_;
        auVar13 = vperm2f128_avx(auVar43,auVar45,0x31);
        auVar50._16_16_ = auVar18._0_16_;
        auVar50._0_16_ = auVar44._0_16_;
        auVar18 = vperm2f128_avx(auVar44,auVar18,0x31);
        auVar43._16_16_ = auVar12._0_16_;
        auVar43._0_16_ = auVar41._0_16_;
        auVar41 = vperm2f128_avx(auVar41,auVar12,0x31);
        auVar45._16_16_ = auVar52._0_16_;
        auVar45._0_16_ = auVar46._0_16_;
        auVar12 = vperm2f128_avx(auVar46,auVar52,0x31);
        auVar52._16_16_ = auVar11._0_16_;
        auVar52._0_16_ = auVar47._0_16_;
        auVar11 = vperm2f128_avx(auVar47,auVar11,0x31);
        auVar46._16_16_ = auVar42._0_16_;
        auVar46._0_16_ = auVar40._0_16_;
        auVar40 = vperm2f128_avx(auVar40,auVar42,0x31);
        *pauVar27 = auVar48;
        pauVar27[1] = auVar50;
        pauVar27[2] = auVar43;
        pauVar27[3] = auVar45;
        pauVar27[4] = auVar52;
        pauVar27[5] = auVar46;
        pauVar27[6] = auVar13;
        pauVar27[7] = auVar18;
        pauVar27[8] = auVar41;
        pauVar27[9] = auVar12;
        pauVar27[10] = auVar11;
        pauVar27[0xb] = auVar40;
        pauVar27 = pauVar27 + 0xc;
        pauVar28 = (undefined1 (*) [32])(*pauVar28 + lVar37);
      }
    }
    if (iVar1 == 4) {
      pauVar25 = (undefined1 (*) [16])((long)B->data + local_48);
      for (iVar23 = 3; iVar23 < max_kk; iVar23 = iVar23 + 4) {
        auVar14 = vunpcklps_avx(pauVar25[-0xb],pauVar25[-10]);
        auVar15 = vunpcklps_avx(pauVar25[-9],pauVar25[-8]);
        auVar6 = vunpckhps_avx(pauVar25[-0xb],pauVar25[-10]);
        auVar7 = vunpckhps_avx(pauVar25[-9],pauVar25[-8]);
        auVar2 = vmovlhps_avx(auVar14,auVar15);
        auVar3 = vunpckhpd_avx(auVar14,auVar15);
        auVar14 = vmovlhps_avx(auVar6,auVar7);
        auVar4 = vunpckhpd_avx(auVar6,auVar7);
        auVar7 = vunpcklps_avx(pauVar25[-7],pauVar25[-6]);
        auVar16 = vunpcklps_avx(pauVar25[-5],pauVar25[-4]);
        auVar15 = vunpckhps_avx(pauVar25[-7],pauVar25[-6]);
        auVar8 = vunpckhps_avx(pauVar25[-5],pauVar25[-4]);
        auVar6 = vmovlhps_avx(auVar7,auVar16);
        auVar16 = vunpckhpd_avx(auVar7,auVar16);
        auVar7 = vmovlhps_avx(auVar15,auVar8);
        auVar5 = vunpckhpd_avx(auVar15,auVar8);
        auVar8 = vunpcklps_avx(pauVar25[-3],pauVar25[-2]);
        auVar17 = vunpcklps_avx(pauVar25[-1],*pauVar25);
        auVar9 = vunpckhps_avx(pauVar25[-3],pauVar25[-2]);
        auVar10 = vunpckhps_avx(pauVar25[-1],*pauVar25);
        auVar15 = vmovlhps_avx(auVar8,auVar17);
        auVar17 = vunpckhpd_avx(auVar8,auVar17);
        auVar8 = vmovlhps_avx(auVar9,auVar10);
        auVar9 = vunpckhpd_avx(auVar9,auVar10);
        *(undefined1 (*) [16])*pauVar27 = auVar2;
        *(undefined1 (*) [16])(*pauVar27 + 0x10) = auVar6;
        *(undefined1 (*) [16])pauVar27[1] = auVar15;
        *(undefined1 (*) [16])(pauVar27[1] + 0x10) = auVar3;
        *(undefined1 (*) [16])pauVar27[2] = auVar16;
        *(undefined1 (*) [16])(pauVar27[2] + 0x10) = auVar17;
        *(undefined1 (*) [16])pauVar27[3] = auVar14;
        *(undefined1 (*) [16])(pauVar27[3] + 0x10) = auVar7;
        *(undefined1 (*) [16])pauVar27[4] = auVar8;
        *(undefined1 (*) [16])(pauVar27[4] + 0x10) = auVar4;
        *(undefined1 (*) [16])pauVar27[5] = auVar5;
        *(undefined1 (*) [16])(pauVar27[5] + 0x10) = auVar9;
        pauVar27 = pauVar27 + 6;
        pauVar25 = (undefined1 (*) [16])(*pauVar25 + lVar38);
      }
    }
    if (iVar1 == 1) {
      pauVar25 = (undefined1 (*) [16])((long)B->data + local_80);
      iVar23 = iVar22;
      while (bVar39 = iVar23 != 0, iVar23 = iVar23 + -1, bVar39) {
        uVar19 = *(undefined8 *)(pauVar25[-2] + 8);
        *(undefined8 *)*pauVar27 = *(undefined8 *)pauVar25[-2];
        *(undefined8 *)(*pauVar27 + 8) = uVar19;
        uVar19 = *(undefined8 *)(pauVar25[-1] + 8);
        *(undefined8 *)(*pauVar27 + 0x10) = *(undefined8 *)pauVar25[-1];
        *(undefined8 *)(*pauVar27 + 0x18) = uVar19;
        *(undefined1 (*) [16])pauVar27[1] = *pauVar25;
        pauVar27 = (undefined1 (*) [32])(pauVar27[1] + 0x10);
        pauVar25 = (undefined1 (*) [16])(*pauVar25 + lVar24);
      }
    }
    lVar30 = lVar30 + 0x180;
    lVar32 = lVar32 + 0xc0;
    lVar26 = lVar26 + 0x30;
    lVar36 = lVar36 + 0x180;
    lVar33 = lVar33 + 0xc0;
    lVar35 = lVar35 + 0x30;
    local_68 = local_68 + 0x180;
    local_70 = local_70 + 0xc0;
    local_58 = local_58 + 0x180;
    local_60 = local_60 + 0xc0;
    local_50 = local_50 + 0x30;
    local_40 = local_40 + 0x180;
    local_48 = local_48 + 0xc0;
    local_80 = local_80 + 0x30;
  }
  for (; (long)uVar31 < lVar29 + -7; uVar31 = uVar31 + 8) {
    if (iVar1 == 8) {
      pauVar28 = (undefined1 (*) [32])((long)B->data + local_58);
      for (iVar23 = 7; iVar23 < max_kk; iVar23 = iVar23 + 8) {
        auVar18 = vunpcklps_avx(pauVar28[-7],pauVar28[-6]);
        auVar11 = vunpckhps_avx(pauVar28[-7],pauVar28[-6]);
        auVar13 = vunpcklps_avx(pauVar28[-5],pauVar28[-4]);
        auVar41 = vunpckhps_avx(pauVar28[-5],pauVar28[-4]);
        auVar46 = vunpcklps_avx(pauVar28[-3],pauVar28[-2]);
        auVar40 = vunpckhps_avx(pauVar28[-3],pauVar28[-2]);
        auVar45 = vunpcklps_avx(pauVar28[-1],*pauVar28);
        auVar12 = vunpckhps_avx(pauVar28[-1],*pauVar28);
        auVar42 = vunpcklpd_avx(auVar18,auVar13);
        auVar18 = vunpckhpd_avx(auVar18,auVar13);
        auVar13 = vunpcklpd_avx(auVar11,auVar41);
        auVar11 = vunpckhpd_avx(auVar11,auVar41);
        auVar43 = vunpcklpd_avx(auVar46,auVar45);
        auVar41 = vunpckhpd_avx(auVar46,auVar45);
        auVar46 = vunpcklpd_avx(auVar40,auVar12);
        auVar40 = vunpckhpd_avx(auVar40,auVar12);
        auVar44._16_16_ = auVar43._0_16_;
        auVar44._0_16_ = auVar42._0_16_;
        auVar47._16_16_ = auVar41._0_16_;
        auVar47._0_16_ = auVar18._0_16_;
        auVar49._16_16_ = auVar46._0_16_;
        auVar49._0_16_ = auVar13._0_16_;
        auVar51._16_16_ = auVar40._0_16_;
        auVar51._0_16_ = auVar11._0_16_;
        auVar12 = vperm2f128_avx(auVar42,auVar43,0x31);
        auVar18 = vperm2f128_avx(auVar18,auVar41,0x31);
        auVar41 = vperm2f128_avx(auVar13,auVar46,0x31);
        auVar11 = vperm2f128_avx(auVar11,auVar40,0x31);
        *pauVar27 = auVar44;
        pauVar27[1] = auVar47;
        pauVar27[2] = auVar49;
        pauVar27[3] = auVar51;
        pauVar27[4] = auVar12;
        pauVar27[5] = auVar18;
        pauVar27[6] = auVar41;
        pauVar27[7] = auVar11;
        pauVar27 = pauVar27 + 8;
        pauVar28 = (undefined1 (*) [32])(*pauVar28 + lVar37);
      }
    }
    if (iVar1 == 4) {
      pauVar25 = (undefined1 (*) [16])((long)B->data + local_60);
      for (iVar23 = 3; iVar23 < max_kk; iVar23 = iVar23 + 4) {
        auVar14 = vunpcklps_avx(pauVar25[-7],pauVar25[-6]);
        auVar15 = vunpcklps_avx(pauVar25[-5],pauVar25[-4]);
        auVar6 = vunpckhps_avx(pauVar25[-7],pauVar25[-6]);
        auVar7 = vunpckhps_avx(pauVar25[-5],pauVar25[-4]);
        auVar2 = vmovlhps_avx(auVar14,auVar15);
        auVar15 = vunpckhpd_avx(auVar14,auVar15);
        auVar14 = vmovlhps_avx(auVar6,auVar7);
        auVar8 = vunpckhpd_avx(auVar6,auVar7);
        auVar7 = vunpcklps_avx(pauVar25[-3],pauVar25[-2]);
        auVar3 = vunpcklps_avx(pauVar25[-1],*pauVar25);
        auVar4 = vunpckhps_avx(pauVar25[-3],pauVar25[-2]);
        auVar16 = vunpckhps_avx(pauVar25[-1],*pauVar25);
        auVar6 = vmovlhps_avx(auVar7,auVar3);
        auVar3 = vunpckhpd_avx(auVar7,auVar3);
        auVar7 = vmovlhps_avx(auVar4,auVar16);
        auVar4 = vunpckhpd_avx(auVar4,auVar16);
        *(undefined1 (*) [16])*pauVar27 = auVar2;
        *(undefined1 (*) [16])(*pauVar27 + 0x10) = auVar6;
        *(undefined1 (*) [16])pauVar27[1] = auVar15;
        *(undefined1 (*) [16])(pauVar27[1] + 0x10) = auVar3;
        *(undefined1 (*) [16])pauVar27[2] = auVar14;
        *(undefined1 (*) [16])(pauVar27[2] + 0x10) = auVar7;
        *(undefined1 (*) [16])pauVar27[3] = auVar8;
        *(undefined1 (*) [16])(pauVar27[3] + 0x10) = auVar4;
        pauVar27 = pauVar27 + 4;
        pauVar25 = (undefined1 (*) [16])(*pauVar25 + lVar38);
      }
    }
    if (iVar1 == 1) {
      pauVar25 = (undefined1 (*) [16])((long)B->data + local_50);
      iVar23 = iVar22;
      while (bVar39 = iVar23 != 0, iVar23 = iVar23 + -1, bVar39) {
        uVar19 = *(undefined8 *)(pauVar25[-1] + 8);
        *(undefined8 *)*pauVar27 = *(undefined8 *)pauVar25[-1];
        *(undefined8 *)(*pauVar27 + 8) = uVar19;
        *(undefined1 (*) [16])(*pauVar27 + 0x10) = *pauVar25;
        pauVar27 = pauVar27 + 1;
        pauVar25 = (undefined1 (*) [16])(*pauVar25 + lVar24);
      }
    }
    lVar30 = lVar30 + 0x100;
    lVar32 = lVar32 + 0x80;
    lVar26 = lVar26 + 0x20;
    lVar36 = lVar36 + 0x100;
    lVar33 = lVar33 + 0x80;
    lVar35 = lVar35 + 0x20;
    local_68 = local_68 + 0x100;
    local_70 = local_70 + 0x80;
    local_58 = local_58 + 0x100;
    local_60 = local_60 + 0x80;
    local_50 = local_50 + 0x20;
  }
  for (; (long)(uVar31 | 3) < lVar29; uVar31 = uVar31 + 4) {
    if (iVar1 == 8) {
      pauVar28 = (undefined1 (*) [32])((long)B->data + local_68);
      for (iVar23 = 7; iVar23 < max_kk; iVar23 = iVar23 + 8) {
        auVar18 = vunpcklps_avx(pauVar28[-3],pauVar28[-2]);
        auVar11 = vunpckhps_avx(pauVar28[-3],pauVar28[-2]);
        auVar12 = vunpcklps_avx(pauVar28[-1],*pauVar28);
        auVar41 = vunpckhps_avx(pauVar28[-1],*pauVar28);
        auVar40 = vunpcklpd_avx(auVar18,auVar12);
        auVar18 = vunpckhpd_avx(auVar18,auVar12);
        auVar12 = vunpcklpd_avx(auVar11,auVar41);
        auVar11 = vunpckhpd_avx(auVar11,auVar41);
        auVar41._16_16_ = auVar18._0_16_;
        auVar41._0_16_ = auVar40._0_16_;
        auVar42._16_16_ = auVar11._0_16_;
        auVar42._0_16_ = auVar12._0_16_;
        auVar18 = vperm2f128_avx(auVar40,auVar18,0x31);
        auVar11 = vperm2f128_avx(auVar12,auVar11,0x31);
        *pauVar27 = auVar41;
        pauVar27[1] = auVar42;
        pauVar27[2] = auVar18;
        pauVar27[3] = auVar11;
        pauVar27 = pauVar27 + 4;
        pauVar28 = (undefined1 (*) [32])(*pauVar28 + lVar37);
      }
    }
    if (iVar1 == 4) {
      pauVar25 = (undefined1 (*) [16])((long)B->data + local_70);
      for (iVar23 = 3; iVar23 < max_kk; iVar23 = iVar23 + 4) {
        auVar14 = vunpcklps_avx(pauVar25[-3],pauVar25[-2]);
        auVar6 = vunpcklps_avx(pauVar25[-1],*pauVar25);
        auVar7 = vunpckhps_avx(pauVar25[-3],pauVar25[-2]);
        auVar15 = vunpckhps_avx(pauVar25[-1],*pauVar25);
        auVar2 = vmovlhps_avx(auVar14,auVar6);
        auVar6 = vunpckhpd_avx(auVar14,auVar6);
        auVar14 = vmovlhps_avx(auVar7,auVar15);
        auVar7 = vunpckhpd_avx(auVar7,auVar15);
        *(undefined1 (*) [16])*pauVar27 = auVar2;
        *(undefined1 (*) [16])(*pauVar27 + 0x10) = auVar6;
        *(undefined1 (*) [16])pauVar27[1] = auVar14;
        *(undefined1 (*) [16])(pauVar27[1] + 0x10) = auVar7;
        pauVar27 = pauVar27 + 2;
        pauVar25 = (undefined1 (*) [16])(*pauVar25 + lVar38);
      }
    }
    if (iVar1 == 1) {
      pauVar25 = (undefined1 (*) [16])((long)B->data + lVar26);
      iVar23 = iVar22;
      while (bVar39 = iVar23 != 0, iVar23 = iVar23 + -1, bVar39) {
        *(undefined1 (*) [16])*pauVar27 = *pauVar25;
        pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
        pauVar25 = (undefined1 (*) [16])(*pauVar25 + lVar24);
      }
    }
    lVar30 = lVar30 + 0x80;
    lVar32 = lVar32 + 0x40;
    lVar26 = lVar26 + 0x10;
    lVar36 = lVar36 + 0x80;
    lVar33 = lVar33 + 0x40;
    lVar35 = lVar35 + 0x10;
    local_68 = local_68 + 0x80;
    local_70 = local_70 + 0x40;
  }
  for (; (long)(uVar31 | 1) < lVar29; uVar31 = uVar31 + 2) {
    if (iVar1 == 8) {
      pauVar28 = (undefined1 (*) [32])((long)B->data + lVar36);
      for (iVar23 = 7; iVar23 < max_kk; iVar23 = iVar23 + 8) {
        auVar11 = vunpcklps_avx(pauVar28[-1],*pauVar28);
        auVar18 = vunpckhps_avx(pauVar28[-1],*pauVar28);
        auVar40._16_16_ = auVar18._0_16_;
        auVar40._0_16_ = auVar11._0_16_;
        auVar18 = vperm2f128_avx(auVar11,auVar18,0x31);
        *pauVar27 = auVar40;
        pauVar27[1] = auVar18;
        pauVar27 = pauVar27 + 2;
        pauVar28 = (undefined1 (*) [32])(*pauVar28 + lVar37);
      }
    }
    if (iVar1 == 4) {
      pauVar25 = (undefined1 (*) [16])((long)B->data + lVar33);
      for (iVar23 = 3; iVar23 < max_kk; iVar23 = iVar23 + 4) {
        auVar14 = vunpcklps_avx(pauVar25[-1],*pauVar25);
        auVar2 = vunpckhps_avx(pauVar25[-1],*pauVar25);
        *(undefined1 (*) [16])*pauVar27 = auVar14;
        *(undefined1 (*) [16])(*pauVar27 + 0x10) = auVar2;
        pauVar27 = pauVar27 + 1;
        pauVar25 = (undefined1 (*) [16])(*pauVar25 + lVar38);
      }
    }
    if (iVar1 == 1) {
      puVar34 = (undefined4 *)((long)B->data + lVar35);
      iVar23 = iVar22;
      while (bVar39 = iVar23 != 0, iVar23 = iVar23 + -1, bVar39) {
        *(undefined4 *)*pauVar27 = puVar34[-1];
        *(undefined4 *)(*pauVar27 + 4) = *puVar34;
        pauVar27 = (undefined1 (*) [32])(*pauVar27 + 8);
        puVar34 = puVar34 + lVar20;
      }
    }
    lVar30 = lVar30 + 0x40;
    lVar32 = lVar32 + 0x20;
    lVar26 = lVar26 + 8;
    lVar36 = lVar36 + 0x40;
    lVar33 = lVar33 + 0x20;
    lVar35 = lVar35 + 8;
  }
  for (; (long)uVar31 < lVar29; uVar31 = uVar31 + 1) {
    if (iVar1 == 8) {
      pauVar28 = (undefined1 (*) [32])((long)B->data + lVar30);
      for (iVar23 = 7; iVar23 < max_kk; iVar23 = iVar23 + 8) {
        *pauVar27 = *pauVar28;
        pauVar27 = pauVar27 + 1;
        pauVar28 = (undefined1 (*) [32])(*pauVar28 + lVar37);
      }
    }
    if (iVar1 == 4) {
      pauVar25 = (undefined1 (*) [16])((long)B->data + lVar32);
      for (iVar23 = 3; iVar23 < max_kk; iVar23 = iVar23 + 4) {
        *(undefined1 (*) [16])*pauVar27 = *pauVar25;
        pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
        pauVar25 = (undefined1 (*) [16])(*pauVar25 + lVar38);
      }
    }
    if (iVar1 == 1) {
      puVar34 = (undefined4 *)((long)B->data + lVar26);
      iVar23 = iVar22;
      while (bVar39 = iVar23 != 0, iVar23 = iVar23 + -1, bVar39) {
        *(undefined4 *)*pauVar27 = *puVar34;
        pauVar27 = (undefined1 (*) [32])(*pauVar27 + 4);
        puVar34 = puVar34 + lVar20;
      }
    }
    lVar30 = lVar30 + 0x20;
    lVar32 = lVar32 + 0x10;
    lVar26 = lVar26 + 4;
  }
  return;
}

Assistant:

static void transpose_pack_B_tile(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk)
{
    const int elempack = B.elempack;
    const int B_hstep = B.dims == 3 ? (int)B.cstep : B.w;

    float* pp = BT;

    int jj = 0;
#if __SSE2__
    for (; jj + 11 < max_jj; jj += 12)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                __m512 _r4 = _mm512_load_ps(p0 + 16 * 4);
                __m512 _r5 = _mm512_load_ps(p0 + 16 * 5);
                __m512 _r6 = _mm512_load_ps(p0 + 16 * 6);
                __m512 _r7 = _mm512_load_ps(p0 + 16 * 7);
                __m512 _r8 = _mm512_load_ps(p0 + 16 * 8);
                __m512 _r9 = _mm512_load_ps(p0 + 16 * 9);
                __m512 _ra = _mm512_load_ps(p0 + 16 * 10);
                __m512 _rb = _mm512_load_ps(p0 + 16 * 11);
                transpose16x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                _mm512_store_ps(pp + 16 * 8, _r8);
                _mm512_store_ps(pp + 16 * 9, _r9);
                _mm512_store_ps(pp + 16 * 10, _ra);
                _mm512_store_ps(pp + 16 * 11, _rb);
                pp += 192;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(p0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(p0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(p0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(p0 + 8 * 7);
                __m256 _r8 = _mm256_load_ps(p0 + 8 * 8);
                __m256 _r9 = _mm256_load_ps(p0 + 8 * 9);
                __m256 _ra = _mm256_load_ps(p0 + 8 * 10);
                __m256 _rb = _mm256_load_ps(p0 + 8 * 11);
                transpose8x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                _mm256_store_ps(pp + 8 * 4, _r4);
                _mm256_store_ps(pp + 8 * 5, _r5);
                _mm256_store_ps(pp + 8 * 6, _r6);
                _mm256_store_ps(pp + 8 * 7, _r7);
                _mm256_store_ps(pp + 8 * 8, _r8);
                _mm256_store_ps(pp + 8 * 9, _r9);
                _mm256_store_ps(pp + 8 * 10, _ra);
                _mm256_store_ps(pp + 8 * 11, _rb);
                pp += 96;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(p0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(p0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(p0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(p0 + 4 * 7);
                __m128 _r8 = _mm_load_ps(p0 + 4 * 8);
                __m128 _r9 = _mm_load_ps(p0 + 4 * 9);
                __m128 _ra = _mm_load_ps(p0 + 4 * 10);
                __m128 _rb = _mm_load_ps(p0 + 4 * 11);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r4);
                _mm_store_ps(pp + 4 * 2, _r8);
                _mm_store_ps(pp + 4 * 3, _r1);
                _mm_store_ps(pp + 4 * 4, _r5);
                _mm_store_ps(pp + 4 * 5, _r9);
                _mm_store_ps(pp + 4 * 6, _r2);
                _mm_store_ps(pp + 4 * 7, _r6);
                _mm_store_ps(pp + 4 * 8, _ra);
                _mm_store_ps(pp + 4 * 9, _r3);
                _mm_store_ps(pp + 4 * 10, _r7);
                _mm_store_ps(pp + 4 * 11, _rb);
                pp += 48;
                p0 += B_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_loadu_ps(p0));
                _mm_store_ps(pp + 4, _mm_loadu_ps(p0 + 4));
                _mm_store_ps(pp + 8, _mm_loadu_ps(p0 + 8));
                pp += 12;
                p0 += B_hstep;
            }
        }
    }
    for (; jj + 7 < max_jj; jj += 8)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                __m512 _r4 = _mm512_load_ps(p0 + 16 * 4);
                __m512 _r5 = _mm512_load_ps(p0 + 16 * 5);
                __m512 _r6 = _mm512_load_ps(p0 + 16 * 6);
                __m512 _r7 = _mm512_load_ps(p0 + 16 * 7);
                transpose16x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                pp += 128;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(p0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(p0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(p0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(p0 + 8 * 7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                _mm256_store_ps(pp + 8 * 4, _r4);
                _mm256_store_ps(pp + 8 * 5, _r5);
                _mm256_store_ps(pp + 8 * 6, _r6);
                _mm256_store_ps(pp + 8 * 7, _r7);
                pp += 64;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(p0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(p0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(p0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(p0 + 4 * 7);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r4);
                _mm_store_ps(pp + 4 * 2, _r1);
                _mm_store_ps(pp + 4 * 3, _r5);
                _mm_store_ps(pp + 4 * 4, _r2);
                _mm_store_ps(pp + 4 * 5, _r6);
                _mm_store_ps(pp + 4 * 6, _r3);
                _mm_store_ps(pp + 4 * 7, _r7);
                pp += 32;
                p0 += B_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_loadu_ps(p0));
                _mm_store_ps(pp + 4, _mm_loadu_ps(p0 + 4));
                pp += 8;
                p0 += B_hstep;
            }
        }
    }
    for (; jj + 3 < max_jj; jj += 4)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                transpose16x4_ps(_r0, _r1, _r2, _r3);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                pp += 64;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                pp += 32;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r1);
                _mm_store_ps(pp + 4 * 2, _r2);
                _mm_store_ps(pp + 4 * 3, _r3);
                pp += 16;
                p0 += B_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_loadu_ps(p0));
                pp += 4;
                p0 += B_hstep;
            }
        }
    }
#endif // __SSE2__
    for (; jj + 1 < max_jj; jj += 2)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16);
                transpose16x2_ps(_r0, _r1);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16, _r1);
                pp += 32;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8);
                transpose8x2_ps(_r0, _r1);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8, _r1);
                pp += 16;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4);
                __m128 _tmp0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _tmp1 = _mm_unpackhi_ps(_r0, _r1);
                _mm_store_ps(pp, _tmp0);
                _mm_store_ps(pp + 4, _tmp1);
                pp += 8;
                p0 += B_hstep * 4;
            }
        }
#endif // __SSE2__
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                pp += 2;
                p0 += B_hstep;
            }
        }
    }
    for (; jj < max_jj; jj += 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                _mm512_store_ps(pp, _mm512_load_ps(p0));
                pp += 16;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                _mm256_store_ps(pp, _mm256_load_ps(p0));
                pp += 8;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                pp += 4;
                p0 += B_hstep * 4;
            }
        }
#endif // __SSE2__
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp += 1;
                p0 += B_hstep;
            }
        }
    }
}